

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void fs_get_field_size(void *serializer,char *name,int name_length,int *isize,int *jsize,int *ksize,
                      int *lsize)

{
  int iVar1;
  DataFieldInfo *this;
  allocator local_61;
  string local_60;
  DataFieldInfo *local_40;
  DataFieldInfo *fieldinfo;
  int *ksize_local;
  int *jsize_local;
  int *isize_local;
  char *pcStack_18;
  int name_length_local;
  char *name_local;
  void *serializer_local;
  
  fieldinfo = (DataFieldInfo *)ksize;
  ksize_local = jsize;
  jsize_local = isize;
  isize_local._4_4_ = name_length;
  pcStack_18 = name;
  name_local = (char *)serializer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,name,(long)name_length,&local_61);
  this = ser::Serializer::FindField((Serializer *)serializer,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = this;
  iVar1 = ser::DataFieldInfo::iSize(this);
  *jsize_local = iVar1;
  iVar1 = ser::DataFieldInfo::jSize(local_40);
  *ksize_local = iVar1;
  iVar1 = ser::DataFieldInfo::kSize(local_40);
  *(int *)&fieldinfo->name_ = iVar1;
  iVar1 = ser::DataFieldInfo::lSize(local_40);
  *lsize = iVar1;
  return;
}

Assistant:

void fs_get_field_size(void* serializer, const char* name, int name_length,
                       int* isize, int* jsize, int* ksize, int* lsize)
{
    const DataFieldInfo& fieldinfo = reinterpret_cast<const Serializer*>(serializer)->FindField(std::string(name, name_length));
    *isize = fieldinfo.iSize();
    *jsize = fieldinfo.jSize();
    *ksize = fieldinfo.kSize();
    *lsize = fieldinfo.lSize();
}